

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
PlainObjectBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
          (PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *this,
          DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
          *other)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  Index size;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  long lVar9;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar2 = *(long *)(other + 0x10);
  if ((lVar2 != 0) &&
     (auVar5 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar5 / SEXT816(lVar2),0) < 1)) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(8,lVar2,SUB168(auVar5 % SEXT816(lVar2),0));
    *puVar7 = std::ios::widen;
    __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (-1 < lVar2) {
    DenseStorage<double,_-1,_-1,_1,_0>::resize
              ((DenseStorage<double,__1,__1,_1,_0> *)this,lVar2,lVar2,1);
    lVar2 = *(long *)other;
    uVar8 = *(ulong *)(other + 0x10);
    if (*(ulong *)(this + 8) != uVar8) {
      if ((long)uVar8 < 0) goto LAB_0010bed0;
      DenseStorage<double,_-1,_-1,_1,_0>::resize
                ((DenseStorage<double,__1,__1,_1,_0> *)this,uVar8,uVar8,1);
    }
    uVar3 = *(ulong *)(this + 8);
    if (uVar3 == uVar8) {
      lVar4 = *(long *)this;
      uVar8 = uVar3 - ((long)uVar3 >> 0x3f) & 0xfffffffffffffffe;
      if (1 < (long)uVar3) {
        lVar9 = 0;
        do {
          puVar7 = (undefined8 *)(lVar2 + lVar9 * 8);
          uVar6 = puVar7[1];
          puVar1 = (undefined8 *)(lVar4 + lVar9 * 8);
          *puVar1 = *puVar7;
          puVar1[1] = uVar6;
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)uVar8);
      }
      if ((long)uVar8 < (long)uVar3) {
        do {
          *(undefined8 *)(lVar4 + uVar8 * 8) = *(undefined8 *)(lVar2 + uVar8 * 8);
          uVar8 = uVar8 + 1;
        } while (uVar3 != uVar8);
      }
      return;
    }
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2eb,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Transpose<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, 1>, T1 = double, T2 = double]"
                 );
  }
LAB_0010bed0:
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/ilanolkies[P]metnum-tp2/eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x11d,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }